

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

string * __thiscall
amrex::ParmParse::PP_entry::print_abi_cxx11_(string *__return_storage_ptr__,PP_entry *this)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  stringstream t;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,(string *)this);
  std::operator<<(poVar1," = ");
  uVar2 = (long)(this->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = uVar2 >> 5;
  uVar3 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar3;
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    std::operator<<(local_1a8,
                    (string *)
                    ((long)&(((this->m_vals).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar3)
                   );
    if ((long)uVar4 < (long)(uVar2 * 0x8000000 + -0x100000000) >> 0x20) {
      std::operator<<(local_1a8," ");
    }
    uVar3 = uVar3 + 0x20;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string
ParmParse::PP_entry::print () const {
    std::stringstream t;
    t << m_name << " = ";
    int n = m_vals.size();
    for ( int i = 0; i < n; i++)
    {
        t << m_vals[i];
        if ( i < n-1 ) t << " ";
    }
    return t.str();
}